

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_ring(rf_vec2 center,float inner_radius,float outer_radius,int start_angle,int end_angle
                 ,int segments,rf_color color)

{
  _Bool _Var1;
  uint uVar2;
  ulong uVar3;
  int end_angle_00;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float __x;
  float radius;
  undefined1 local_8c;
  undefined1 local_88;
  undefined4 local_7c;
  undefined4 local_58;
  undefined4 uStack_54;
  
  if (start_angle == end_angle) {
    return;
  }
  radius = (float)(~-(uint)(outer_radius < inner_radius) & (uint)outer_radius |
                  (~-(uint)(0.0 < inner_radius) & 0x3dcccccd |
                  -(uint)(0.0 < inner_radius) & (uint)inner_radius) &
                  -(uint)(outer_radius < inner_radius));
  end_angle_00 = start_angle;
  if (start_angle < end_angle) {
    end_angle_00 = end_angle;
  }
  if (inner_radius <= outer_radius) {
    outer_radius = inner_radius;
  }
  if (end_angle < start_angle) {
    start_angle = end_angle;
  }
  if (segments < 4) {
    fVar5 = -0.5 / radius + 1.0;
    fVar5 = fVar5 * fVar5;
    fVar5 = acosf(fVar5 + fVar5 + -1.0);
    fVar5 = ceilf(6.2831855 / fVar5);
    uVar2 = (uint)((fVar5 * (float)(end_angle_00 - start_angle)) / 360.0);
    segments = 4;
    if (0 < (int)uVar2) {
      segments = uVar2;
    }
  }
  if (0.0 < outer_radius) {
    _Var1 = rf_gfx_check_buffer_limit(segments * 6);
    if (_Var1) {
      rf_gfx_draw();
    }
    local_7c = (float)start_angle;
    rf_gfx_begin(RF_TRIANGLES);
    uStack_54 = center.y;
    uVar3 = 0;
    if (0 < segments) {
      uVar3 = (ulong)(uint)segments;
    }
    local_88 = color.g;
    local_8c = color.b;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      rf_gfx_color4ub(color.r,local_88,local_8c,color.a);
      __x = local_7c * 0.017453292;
      fVar5 = sinf(__x);
      local_58 = center.x;
      fVar6 = cosf(__x);
      rf_gfx_vertex2f(fVar5 * outer_radius + local_58,fVar6 * outer_radius + uStack_54);
      fVar5 = sinf(__x);
      fVar6 = cosf(__x);
      rf_gfx_vertex2f(fVar5 * radius + local_58,fVar6 * radius + uStack_54);
      local_7c = local_7c + (float)(end_angle_00 - start_angle) / (float)segments;
      fVar5 = local_7c * 0.017453292;
      fVar6 = sinf(fVar5);
      fVar7 = cosf(fVar5);
      rf_gfx_vertex2f(fVar6 * outer_radius + local_58,fVar7 * outer_radius + uStack_54);
      fVar6 = sinf(fVar5);
      fVar7 = cosf(fVar5);
      rf_gfx_vertex2f(fVar6 * outer_radius + local_58,fVar7 * outer_radius + uStack_54);
      fVar6 = sinf(__x);
      fVar7 = cosf(__x);
      rf_gfx_vertex2f(fVar6 * radius + local_58,fVar7 * radius + uStack_54);
      fVar6 = sinf(fVar5);
      fVar5 = cosf(fVar5);
      rf_gfx_vertex2f(fVar6 * radius + local_58,fVar5 * radius + uStack_54);
    }
    rf_gfx_end();
    return;
  }
  rf_draw_circle_sector(center,radius,start_angle,end_angle_00,segments,color);
  return;
}

Assistant:

RF_API void rf_draw_ring(rf_vec2 center, float inner_radius, float outer_radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (start_angle == end_angle) return;

    // Function expects (outerRadius > innerRadius)
    if (outer_radius < inner_radius)
    {
        float tmp = outer_radius;
        outer_radius = inner_radius;
        inner_radius = tmp;

        if (outer_radius <= 0.0f) outer_radius = 0.1f;
    }

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/outer_radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    // Not a ring
    if (inner_radius <= 0.0f)
    {
        rf_draw_circle_sector(center, outer_radius, start_angle, end_angle, segments, color);
        return;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;
    if (rf_gfx_check_buffer_limit(6*segments)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

        angle += step_length;
    }
    rf_gfx_end();

}